

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

void uv_fs_req_cleanup(uv_fs_t *req)

{
  free(req->path);
  req->path = (char *)0x0;
  req->new_path = (char *)0x0;
  if ((uv_stat_t *)req->ptr != &req->statbuf) {
    free(req->ptr);
  }
  req->ptr = (void *)0x0;
  return;
}

Assistant:

void uv_fs_req_cleanup(uv_fs_t* req) {
  free((void*) req->path);
  req->path = NULL;
  req->new_path = NULL;

  if (req->ptr != &req->statbuf)
    free(req->ptr);
  req->ptr = NULL;
}